

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

int is_ip_address(char *hostname)

{
  int iVar1;
  bool local_22;
  bool local_21;
  undefined1 local_20 [8];
  in6_addr addr;
  char *hostname_local;
  
  local_21 = false;
  if ((hostname != (char *)0x0) && (local_21 = false, *hostname != '\0')) {
    addr.__in6_u._8_8_ = hostname;
    iVar1 = inet_pton(2,hostname,local_20);
    local_22 = true;
    if (iVar1 == 0) {
      iVar1 = inet_pton(10,(char *)addr.__in6_u._8_8_,local_20);
      local_22 = iVar1 != 0;
    }
    local_21 = local_22;
  }
  return (int)local_21;
}

Assistant:

static int is_ip_address(const char *hostname)
{
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  return (hostname && hostname[0] && (Curl_inet_pton(AF_INET, hostname, &addr)
#ifdef ENABLE_IPV6
          || Curl_inet_pton(AF_INET6, hostname, &addr)
#endif
         ));
}